

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.hpp
# Opt level: O0

ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableEntry> * __thiscall
rsg::VariableManager::getBegin<rsg::(anonymous_namespace)::IsReadableEntry>
          (ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableEntry> *__return_storage_ptr__,
          VariableManager *this,IsReadableEntry filter)

{
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  begin;
  bool bVar1;
  reference ppVVar2;
  const_iterator end;
  byte local_61;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_28;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_20;
  const_iterator first;
  VariableManager *this_local;
  IsReadableEntry filter_local;
  
  first._M_current = (ValueEntry **)this;
  this_local._4_4_ = filter.m_exprFlags;
  local_20._M_current =
       (ValueEntry **)
       std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::begin
                 (&this->m_entryCache);
  while( true ) {
    local_28._M_current =
         (ValueEntry **)
         std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                   (&this->m_entryCache);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    local_61 = 0;
    if (bVar1) {
      ppVVar2 = __gnu_cxx::
                __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                ::operator*(&local_20);
      bVar1 = anon_unknown_0::IsReadableEntry::operator()
                        ((IsReadableEntry *)((long)&this_local + 4),*ppVVar2);
      local_61 = bVar1 ^ 0xff;
    }
    begin._M_current = local_20._M_current;
    if ((local_61 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
    ::operator++(&local_20,0);
  }
  end = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                  (&this->m_entryCache);
  ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableEntry>::ValueEntryIterator
            (__return_storage_ptr__,(const_iterator)begin._M_current,end,this_local._4_4_);
  return __return_storage_ptr__;
}

Assistant:

ValueEntryIterator<Filter> VariableManager::getBegin (Filter filter) const
{
	std::vector<const ValueEntry*>::const_iterator first = m_entryCache.begin();
	while (first != m_entryCache.end() && !filter(*first))
		first++;
	return ValueEntryIterator<Filter>(first, m_entryCache.end(), filter);
}